

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

void trial::protocol::bintoken::
     format<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<char>>
               (basic_variable<std::allocator<char>_> *data,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *result)

{
  writer writer;
  writer wStack_78;
  
  basic_writer<16ul>::basic_writer<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&wStack_78,result);
  partial::format<std::allocator<char>>(data,&wStack_78);
  basic_writer<16UL>::~basic_writer(&wStack_78);
  return;
}

Assistant:

void format(const trial::dynamic::basic_variable<Allocator>& data,
            T& result)
{
    bintoken::writer writer(result);
    partial::format(data, writer);
}